

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O2

void __thiscall
QTextCursor::insertBlock(QTextCursor *this,QTextBlockFormat *format,QTextCharFormat *_charFormat)

{
  QTextCursorPrivate *pQVar1;
  char *__filename;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->d).d.ptr != (QTextCursorPrivate *)0x0) {
    pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
    if (pQVar1->priv != (QTextDocumentPrivate *)0x0) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextFormat::QTextFormat((QTextFormat *)local_38,&_charFormat->super_QTextFormat);
      __filename = (char *)0x0;
      QTextFormat::clearProperty((QTextFormat *)local_38,0);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextDocumentPrivate::beginEditBlock(pQVar1->priv);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextCursorPrivate::remove(pQVar1,__filename);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextCursorPrivate::insertBlock(pQVar1,format,(QTextCharFormat *)local_38);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextDocumentPrivate::endEditBlock(pQVar1->priv);
      pQVar1 = QSharedDataPointer<QTextCursorPrivate>::operator->(&this->d);
      QTextCursorPrivate::setX(pQVar1);
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextCursor::insertBlock(const QTextBlockFormat &format, const QTextCharFormat &_charFormat)
{
    if (!d || !d->priv)
        return;

    QTextCharFormat charFormat = _charFormat;
    charFormat.clearProperty(QTextFormat::ObjectIndex);

    d->priv->beginEditBlock();
    d->remove();
    d->insertBlock(format, charFormat);
    d->priv->endEditBlock();
    d->setX();
}